

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall RingtoneScreen::RingtoneScreen(RingtoneScreen *this,QWidget *parent)

{
  QVBoxLayout *pQVar1;
  TextLabel *pTVar2;
  QFlags<Qt::AlignmentFlag> local_74;
  QLatin1String local_70;
  QString local_60;
  WindowFlags local_44;
  TextLabel *local_40;
  TextLabel *label;
  QVBoxLayout *local_28;
  QVBoxLayout *l;
  QWidget *local_18;
  QWidget *parent_local;
  RingtoneScreen *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)((long)&l + 4));
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)l._4_4_);
  *(undefined ***)this = &PTR_metaObject_00245390;
  *(undefined ***)&this->field_0x10 = &PTR__RingtoneScreen_00245540;
  pQVar1 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar1,&this->super_QWidget);
  local_28 = pQVar1;
  pTVar2 = (TextLabel *)operator_new(0x30);
  QFlags<Qt::WindowType>::QFlags(&local_44);
  QtMWidgets::TextLabel::TextLabel(pTVar2,&this->super_QWidget,local_44);
  local_40 = pTVar2;
  QLatin1String::QLatin1String(&local_70,"We have to implement list with ringtones in the future");
  QString::QString(&local_60,local_70);
  QtMWidgets::TextLabel::setText(pTVar2,&local_60);
  QString::~QString(&local_60);
  pQVar1 = local_28;
  pTVar2 = local_40;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_74);
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pTVar2,(QFlags_conflict1 *)0x0);
  return;
}

Assistant:

RingtoneScreen( QWidget * parent )
		:	QWidget( parent )
	{
		QVBoxLayout * l = new QVBoxLayout( this );

		QtMWidgets::TextLabel * label = new QtMWidgets::TextLabel( this );
		label->setText( QLatin1String( "We have to implement list with "
			"ringtones in the future" ) );

		l->addWidget( label );
	}